

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O1

int __thiscall Matrix::remove(Matrix *this,char *__filename)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  Physical *pPVar4;
  int *piVar5;
  void *__s;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  
  iVar2 = this->nMatrixDimension;
  lVar7 = (long)iVar2;
  uVar12 = 0xffffffffffffffff;
  if (-1 < lVar7) {
    uVar12 = lVar7 * 4;
  }
  piVar5 = (int *)operator_new__(uVar12);
  if (0 < lVar7) {
    lVar11 = *(long *)__filename;
    piVar3 = this->pSize;
    lVar6 = 0;
    do {
      if ((*(int *)(lVar11 + lVar6 * 4) < 0) || (iVar8 = piVar3[lVar6], iVar8 < 2)) {
        iVar8 = piVar3[lVar6];
      }
      else {
        iVar8 = iVar8 + -1;
      }
      piVar5[lVar6] = iVar8;
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  __s = operator_new__(uVar12);
  if (0 < iVar2) {
    memset(__s,0,lVar7 * 4);
  }
  iVar8 = this->nData;
  if (0 < iVar8) {
    piVar3 = this->pSize;
    iVar9 = 0;
    do {
      piVar1 = (int *)((long)__s + lVar7 * 4 + -4);
      *piVar1 = *piVar1 + 1;
      lVar11 = (long)(iVar2 + -1);
      iVar10 = iVar2;
      if (iVar2 + -1 != 0) {
        do {
          if (piVar3[lVar11] <= *(int *)((long)__s + lVar11 * 4)) {
            *(undefined4 *)((long)__s + lVar11 * 4) = 0;
            piVar1 = (int *)((long)__s + (long)iVar10 * 4 + -8);
            *piVar1 = *piVar1 + 1;
          }
          iVar10 = iVar10 + -1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar8);
  }
  if (this->pMult != (int *)0x0) {
    operator_delete__(this->pMult);
  }
  pPVar4 = this->pPhysicals;
  if (pPVar4 != (Physical *)0x0) {
    lVar7 = *(long *)&pPVar4[-1].physicalUnit.nExpPrefix;
    if (lVar7 != 0) {
      lVar11 = lVar7 * 0x98;
      do {
        Physical::~Physical((Physical *)((long)pPVar4[-1].physicalUnit.siUnits + lVar11 + -0x34));
        lVar11 = lVar11 + -0x98;
      } while (lVar11 != 0);
    }
    operator_delete__(&pPVar4[-1].physicalUnit.nExpPrefix,lVar7 * 0x98 + 8);
  }
  if (this->pSize != (int *)0x0) {
    operator_delete__(this->pSize);
  }
  this->pSize = piVar5;
  init(this,(EVP_PKEY_CTX *)0x1);
  return (int)this;
}

Assistant:

Matrix &Matrix::remove(vector<int> removal)
{
	// create new data store and new shape vector
	int *newShape = new int[nMatrixDimension];
	int newSize = 1;
	for (int i=0; i<nMatrixDimension; ++i) {
		if (removal[i] >= 0 && pSize[i]>1)
			newShape[i] = pSize[i]-1;
		else
			newShape[i] = pSize[i];
		newSize *= newShape[i];
	}
	double *newData = new double[newSize];
	
	// vector with current index coordinates
	int *index = new int[nMatrixDimension];
	for (int i=0; i<nMatrixDimension; ++i)
		index[i] = 0;
	
	// copy each data point
	int n=0; // single index into new data
	for (int i=0; i<nData; ++i) {
		
		// compare index vector to removal vector
		bool copyData = true;
		for (int r=0; r<nMatrixDimension; ++r)
			if (removal[r] != -1 && index[r] == removal[r]) {
				copyData = false;
				break;
			}
		
		// copy if index does not match removal vector
		if (copyData)
			newData[n++] = pData[i];
		
		// increment  index vector
		index[nMatrixDimension-1]++;
		for (int k=nMatrixDimension-1; k; --k)
			if (index[k] >= pSize[k]) {
				index[k] = 0;
				index[k-1]++;
			}		
	}
	
	// assign new data
	delete[] pMult;
	delete[] pPhysicals;
	delete[] pSize;
	pSize = newShape;
	init();
	
	return *this;
}